

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

NULLCRef * NULLCVector::VectorIndex(NULLCRef *__return_storage_ptr__,vector *vec,uint index)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  
  *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  if (vec->size <= index) {
    nullcThrowError("operator[] array index out of bounds");
    return __return_storage_ptr__;
  }
  if (vec->flags == 0) {
    __return_storage_ptr__->typeID = vec->elemType;
  }
  else {
    uVar2 = nullcGetSubType(0);
    uVar1 = vec->flags;
    __return_storage_ptr__->typeID = uVar2;
    if (uVar1 != 0) {
      pcVar3 = *(char **)((vec->data).ptr + (ulong)index * 8);
      goto LAB_0012bace;
    }
  }
  pcVar3 = (vec->data).ptr + index * vec->elemSize;
LAB_0012bace:
  __return_storage_ptr__->ptr = pcVar3;
  return __return_storage_ptr__;
}

Assistant:

NULLCRef VectorIndex(vector* vec, unsigned int index)
	{
		NULLCRef ret = { 0, 0 };
		if(index >= vec->size)
		{
			nullcThrowError("operator[] array index out of bounds");
			return ret;
		}
		ret.typeID = (vec->flags ? nullcGetSubType(vec->elemType) : vec->elemType);
		ret.ptr = vec->flags ? ((char**)vec->data.ptr)[index] : (vec->data.ptr + vec->elemSize * index);
		return ret;
	}